

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartThreading.cpp
# Opt level: O3

bool anon_unknown.dwarf_1ee9f1::checkPixels<float>
               (Array2D<float> *ph,int lx,int rx,int ly,int ry,int width)

{
  ostream *poVar1;
  long *plVar2;
  int iVar3;
  bool bVar4;
  float *pfVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  float fVar10;
  
  bVar4 = true;
  if (ly <= ry) {
    lVar9 = (long)ly;
    lVar8 = lVar9 * 4;
    iVar3 = ly * width;
    pfVar5 = ph->_data + ph->_sizeY * lVar9;
    bVar4 = false;
    do {
      lVar7 = (long)lx;
      if (lx <= rx) {
        do {
          iVar6 = (iVar3 + (int)lVar7) % 0x801;
          fVar10 = (float)iVar6;
          if ((pfVar5[lVar7] != fVar10) || (NAN(pfVar5[lVar7]) || NAN(fVar10))) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value at ",9);
            poVar1 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
            poVar1 = std::ostream::_M_insert<double>
                               ((double)*(float *)((long)ph->_data + lVar7 * 4 + lVar8 * ph->_sizeY)
                               );
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,", should be ",0xc);
            plVar2 = (long *)std::ostream::operator<<(poVar1,iVar6);
            std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
            std::ostream::put((char)plVar2);
            std::ostream::flush();
            std::ostream::flush();
            return bVar4;
          }
          lVar7 = lVar7 + 1;
        } while (rx + 1 != (int)lVar7);
      }
      lVar7 = lVar9 + 1;
      bVar4 = ry <= lVar9;
      lVar8 = lVar8 + 4;
      iVar3 = iVar3 + width;
      pfVar5 = pfVar5 + ph->_sizeY;
      lVar9 = lVar7;
    } while (ry + 1 != (int)lVar7);
  }
  return bVar4;
}

Assistant:

bool checkPixels (Array2D<T> &ph, int lx, int rx, int ly, int ry, int width)
{
    for (int y = ly; y <= ry; ++y)
        for (int x = lx; x <= rx; ++x)
            if (ph[y][x] != static_cast<T>(((y * width + x) % 2049)))
            {
                cout << "value at " << x << ", " << y << ": " << ph[y][x]
                     << ", should be " << (y * width + x) % 2049 << endl << flush;
                return false;
            }
    return true;
}